

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall
llm_graph_context::build_inp_embd(llm_graph_context *this,ggml_tensor *tok_embd)

{
  float fVar1;
  undefined8 uVar2;
  ggml_tensor *pgVar3;
  bool bVar4;
  ggml_tensor *pgVar5;
  pointer plVar6;
  undefined8 uVar7;
  pointer this_00;
  undefined8 in_RSI;
  long in_RDI;
  ggml_tensor *inpL_delta;
  float scale;
  float adapter_scale;
  llama_adapter_lora_weight *lw;
  value_type *lora;
  const_iterator __end2;
  const_iterator __begin2;
  llama_adapter_loras *__range2;
  ggml_tensor *cur;
  __single_object inp;
  int64_t n_embd;
  unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
  *in_stack_fffffffffffffed8;
  _Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>
  *in_stack_fffffffffffffee0;
  ggml_tensor *in_stack_fffffffffffffee8;
  ggml_tensor *in_stack_fffffffffffffef0;
  ggml_tensor *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_> local_78;
  undefined8 local_70;
  float local_68;
  float local_64;
  llama_adapter_lora_weight *local_60;
  reference local_58;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_50;
  _Node_iterator_base<std::pair<llama_adapter_lora_*const,_float>,_false> local_48;
  undefined8 local_40;
  ggml_tensor *local_28;
  ulong local_18;
  undefined8 local_10;
  
  local_18 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 8);
  local_10 = in_RSI;
  std::make_unique<llm_graph_input_embd>();
  local_28 = (ggml_tensor *)0x0;
  if (*(long *)(*(long *)(in_RDI + 0x18) + 0x10) == 0) {
    pgVar5 = (ggml_tensor *)
             ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,local_18,
                                *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4));
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x4345da);
    plVar6->embd = pgVar5;
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x4345ed);
    ggml_set_input(plVar6->embd);
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x434605);
    local_28 = plVar6->embd;
  }
  else {
    pgVar5 = (ggml_tensor *)
             ggml_new_tensor_1d(*(undefined8 *)(in_RDI + 0xc0),0x1a,
                                *(undefined4 *)(*(long *)(in_RDI + 0x18) + 4));
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x434307);
    plVar6->tokens = pgVar5;
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x434320);
    ggml_set_input(plVar6->tokens);
    uVar2 = *(undefined8 *)(in_RDI + 0xc0);
    plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
             operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                         *)0x43435f);
    local_28 = (ggml_tensor *)ggml_get_rows(uVar2,local_10,plVar6->tokens);
    local_40 = *(undefined8 *)(in_RDI + 0xe0);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
         ::begin(in_stack_fffffffffffffed8);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<llama_adapter_lora_*,_float,_std::hash<llama_adapter_lora_*>,_std::equal_to<llama_adapter_lora_*>,_std::allocator<std::pair<llama_adapter_lora_*const,_float>_>_>
         ::end(in_stack_fffffffffffffed8);
    while (bVar4 = std::__detail::operator!=(&local_48,&local_50), bVar4) {
      local_58 = std::__detail::
                 _Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>::
                 operator*((_Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>
                            *)0x4343fe);
      local_60 = llama_adapter_lora::get_weight
                           ((llama_adapter_lora *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                            in_stack_ffffffffffffff40);
      if (local_60 != (llama_adapter_lora_weight *)0x0) {
        local_64 = local_58->second;
        in_stack_ffffffffffffff4c =
             llama_adapter_lora_weight::get_scale(local_60,local_58->first->alpha,local_64);
        uVar2 = *(undefined8 *)(in_RDI + 0xc0);
        pgVar5 = local_60->a;
        pgVar3 = local_60->b;
        local_68 = in_stack_ffffffffffffff4c;
        plVar6 = std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::
                 operator->((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>
                             *)0x4344ed);
        in_stack_ffffffffffffff40 = (ggml_tensor *)ggml_get_rows(uVar2,pgVar5,plVar6->tokens);
        uVar7 = ggml_mul_mat(uVar2,pgVar3,in_stack_ffffffffffffff40);
        local_70 = ggml_scale(local_68,uVar2,uVar7);
        local_28 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_28,local_70);
      }
      std::__detail::_Node_const_iterator<std::pair<llama_adapter_lora_*const,_float>,_false,_false>
      ::operator++(in_stack_fffffffffffffee0);
    }
  }
  fVar1 = *(float *)(*(long *)(in_RDI + 8) + 0x18fc);
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    in_stack_fffffffffffffef0 =
         (ggml_tensor *)
         ggml_scale(*(undefined4 *)(*(long *)(in_RDI + 8) + 0x18fc),*(undefined8 *)(in_RDI + 0xc0),
                    local_28);
    local_28 = in_stack_fffffffffffffef0;
  }
  cb((llm_graph_context *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
     (char *)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  this_00 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4346a4);
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_embd,std::default_delete<llm_graph_input_embd>,void>
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_fffffffffffffef0,&local_78);
  llm_graph_result::add_input(this_00,(llm_graph_input_ptr *)in_stack_fffffffffffffed8);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)this_00);
  std::unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_embd,_std::default_delete<llm_graph_input_embd>_> *)this_00
            );
  return local_28;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_embd(ggml_tensor * tok_embd) const {
    const int64_t n_embd = hparams.n_embd;

    auto inp = std::make_unique<llm_graph_input_embd>();

    ggml_tensor * cur = nullptr;

    if (ubatch.token) {
        inp->tokens = ggml_new_tensor_1d(ctx0, GGML_TYPE_I32, ubatch.n_tokens);
        //cb(inp->tokens, "inp_tokens", -1);
        ggml_set_input(inp->tokens);

        cur = ggml_get_rows(ctx0, tok_embd, inp->tokens);

        // apply lora for embedding tokens if needed
        for (const auto & lora : *loras) {
            llama_adapter_lora_weight * lw = lora.first->get_weight(tok_embd);
            if (lw == nullptr) {
                continue;
            }

            const float adapter_scale = lora.second;
            const float scale = lw->get_scale(lora.first->alpha, adapter_scale);

            ggml_tensor * inpL_delta = ggml_scale(ctx0, ggml_mul_mat(
                        ctx0, lw->b, // non-transposed lora_b
                        ggml_get_rows(ctx0, lw->a, inp->tokens)
                        ), scale);

            cur = ggml_add(ctx0, cur, inpL_delta);
        }
    } else {
        inp->embd = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, ubatch.n_tokens);
        ggml_set_input(inp->embd);

        cur = inp->embd;
    }

    // For Granite architecture
    if (hparams.f_embedding_scale != 0.0f) {
        cur = ggml_scale(ctx0, cur, hparams.f_embedding_scale);
    }

    cb(cur, "inp_embd", -1);

    res->add_input(std::move(inp));

    return cur;
}